

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

void __thiscall xmrig::Network::getConnection(Network *this,Value *reply,Document *doc,int version)

{
  NetworkState *this_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  uint32_t uVar1;
  size_t sVar2;
  uint64_t value;
  Value connection;
  Data local_b8;
  int local_9c;
  Data local_98;
  Data local_88;
  Value *local_78;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = doc->allocator_;
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x3000000000000;
  local_40.s = "pool";
  local_40.length = 4;
  this_00 = &this->m_state;
  local_9c = version;
  local_78 = reply;
  local_50.s = this_00->pool;
  sVar2 = strlen(this_00->pool);
  local_50.length = (SizeType)sVar2;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,&local_40,&local_50,allocator);
  String::toJSON((String *)&local_b8.s);
  local_88.s.str = (Ch *)0x40500000018db11;
  local_88.n = (Number)0x2;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,allocator);
  local_60.s = "uptime";
  local_60.length = 6;
  value = NetworkState::connectionTime(this_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_98.s,&local_60,value,allocator);
  uVar1 = NetworkState::latency(this_00);
  local_b8.s.str = (Ch *)0x40500000018db14;
  local_b8.n = (Number)0x4;
  local_88._4_1_ = '\0';
  local_88._5_1_ = '\0';
  local_88._6_1_ = '\0';
  local_88._7_1_ = '\0';
  local_88._0_4_ = uVar1;
  local_88.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,allocator);
  local_70.s = "failures";
  local_70.length = 8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_98.s,&local_70,(this->m_state).failures,allocator);
  String::toJSON((String *)&local_b8.s);
  local_88.s.str = (Ch *)0x4050000001881cc;
  local_88.n = (Number)0x3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,allocator);
  String::toJSON((String *)&local_b8.s);
  local_88.s.str = (Ch *)0x4050000001881a6;
  local_88.n = (Number)0xf;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,allocator);
  if (local_9c == 1) {
    local_b8.n.i64 = (Number)0x0;
    local_b8.s.str = (Ch *)0x4000000000000;
    local_88.s.str = (Ch *)0x40500000018db22;
    local_88.n = (Number)0x9;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_b8.s,allocator);
  }
  local_88.s.str = (Ch *)0x40500000018a6a2;
  local_88.n = (Number)0xa;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(local_78,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,allocator);
  return;
}

Assistant:

void xmrig::Network::getConnection(rapidjson::Value &reply, rapidjson::Document &doc, int version) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value connection(kObjectType);
    connection.AddMember("pool",            StringRef(m_state.pool), allocator);
    connection.AddMember("ip",              m_state.ip().toJSON(), allocator);
    connection.AddMember("uptime",          m_state.connectionTime(), allocator);
    connection.AddMember("ping",            m_state.latency(), allocator);
    connection.AddMember("failures",        m_state.failures, allocator);
    connection.AddMember("tls",             m_state.tls().toJSON(), allocator);
    connection.AddMember("tls-fingerprint", m_state.fingerprint().toJSON(), allocator);

    if (version == 1) {
        connection.AddMember("error_log", Value(kArrayType), allocator);
    }

    reply.AddMember("connection", connection, allocator);
}